

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

uint __thiscall
TArray<FSessionStatistics,_FSessionStatistics>::Reserve
          (TArray<FSessionStatistics,_FSessionStatistics> *this,uint amount)

{
  char *pcVar1;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  
  Grow(this,amount);
  uVar2 = this->Count;
  uVar4 = (ulong)uVar2;
  uVar5 = amount + uVar2;
  this->Count = uVar5;
  lVar3 = uVar4 * 0x48 + 0x38;
  for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    pcVar1 = (this->Array->super_FLevelStatistics).info + lVar3;
    pcVar1[0] = '\0';
    pcVar1[1] = '\0';
    pcVar1[2] = '\0';
    pcVar1[3] = '\0';
    pcVar1[4] = '\0';
    pcVar1[5] = '\0';
    pcVar1[6] = '\0';
    pcVar1[7] = '\0';
    pcVar1[8] = '\0';
    pcVar1[9] = '\0';
    pcVar1[10] = '\0';
    pcVar1[0xb] = '\0';
    pcVar1[0xc] = '\0';
    pcVar1[0xd] = '\0';
    pcVar1[0xe] = '\0';
    pcVar1[0xf] = '\0';
    uVar5 = this->Count;
    lVar3 = lVar3 + 0x48;
  }
  return uVar2;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}